

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall rengine::OpenGLRenderer::renderToLayer(OpenGLRenderer *this,Element *e)

{
  vec2 vVar1;
  vec2 vVar2;
  byte bVar3;
  uint uVar4;
  Node *pNVar5;
  pointer puVar6;
  vec2 step;
  mat4 o;
  mat4 o_00;
  mat4 o_01;
  mat4 o_02;
  mat4 o_03;
  mat4 o_04;
  vec2 textureSize;
  vec2 textureSize_00;
  GLuint GVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  float *pfVar11;
  undefined8 *puVar12;
  mat4 *pmVar13;
  char *o_05;
  undefined8 *puVar14;
  mat4 *pmVar15;
  mat4 *pmVar16;
  int iVar17;
  GLuint *pGVar18;
  byte bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  rect2d r;
  undefined4 uVar28;
  undefined4 in_stack_fffffffffffffbcc;
  undefined4 uVar29;
  undefined4 in_stack_fffffffffffffbd4;
  undefined8 uVar30;
  undefined1 in_stack_fffffffffffffbe0 [40];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  undefined8 local_3c4;
  undefined8 uStack_3bc;
  undefined8 local_3b4;
  float local_3a8 [6];
  undefined8 local_390;
  undefined8 uStack_388;
  undefined4 local_380;
  undefined8 local_37c;
  undefined8 uStack_374;
  undefined8 local_36c;
  undefined8 local_360;
  undefined4 local_358;
  float local_354;
  undefined8 local_350;
  undefined4 local_348;
  float local_344;
  undefined8 local_340;
  undefined4 local_338;
  undefined8 local_334;
  undefined8 uStack_32c;
  undefined8 local_324;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined8 local_2ec;
  undefined8 uStack_2e4;
  undefined8 local_2dc;
  float local_2d0 [6];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  undefined8 local_2a4;
  undefined8 uStack_29c;
  undefined8 local_294;
  undefined8 local_288;
  undefined4 local_280;
  float local_27c;
  undefined8 local_278;
  undefined4 local_270;
  float local_26c;
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined8 uStack_254;
  undefined8 local_24c;
  float local_240 [2];
  mat4 storedProjection;
  mat4 local_1b8;
  mat4 local_174;
  mat4 local_130;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  vec2 local_b8;
  Node *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  mat4 *local_88;
  Node *local_80;
  vec2 local_78;
  undefined8 uStack_70;
  vec2 local_68;
  undefined8 uStack_60;
  GLuint local_54;
  GLuint *local_50;
  vec2 local_48;
  undefined8 uStack_40;
  byte local_31;
  
  bVar19 = 0;
  uVar4 = *(uint *)&e->field_0x18;
  if ((uVar4 >> 0x1e & 1) == 0) {
    __assert_fail("e->layered",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                  ,0x2cf,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
  }
  vVar1 = this->m_vertices[e->vboOffset];
  fVar20 = vVar1.x;
  fVar21 = vVar1.y;
  fVar22 = 0.0;
  vVar2 = this->m_vertices[e->vboOffset + 3];
  fVar25 = vVar2.x;
  fVar26 = vVar2.y;
  fVar27 = 0.0;
  fVar24 = fVar25 - fVar20;
  if ((0.0 < fVar24) && (fVar23 = fVar26 - fVar21, 0.0 < fVar23)) {
    bVar3 = this->field_0x1f8;
    local_54 = this->m_fbo;
    pmVar16 = &this->m_proj;
    pmVar13 = pmVar16;
    pfVar11 = local_240;
    for (lVar10 = 0x11; lVar10 != 0; lVar10 = lVar10 + -1) {
      *pfVar11 = pmVar13->m[0];
      pmVar13 = (mat4 *)(pmVar13->m + 1);
      pfVar11 = pfVar11 + 1;
    }
    local_b8 = this->m_surfaceSize;
    this->field_0x1f8 = (byte)(uVar4 >> 0x1d) & 3 | bVar3;
    pNVar5 = e->node;
    local_b0 = (Node *)0x0;
    if (pNVar5->field_0x30 == '\x04') {
      local_b0 = pNVar5;
    }
    local_80 = (Node *)0x0;
    if (pNVar5->field_0x30 == '\x05') {
      local_80 = pNVar5;
    }
    local_a8 = (float)CONCAT31(local_a8._1_3_,local_b0 != (Node *)0x0 || local_80 != (Node *)0x0);
    fStack_e4 = fVar26;
    fStack_d4 = fVar21;
    local_78 = vVar1;
    if (local_b0 != (Node *)0x0 || local_80 != (Node *)0x0) {
      fVar20 = fVar20 + -1.0;
      fVar25 = fVar25 + 1.0;
      fVar24 = fVar25 - fVar20;
      local_78.y = fVar21;
      local_78.x = fVar20;
      fVar23 = (fVar26 + 1.0) - (fVar21 + -1.0);
      fVar22 = fVar21;
      fStack_e4 = fVar26 + 1.0;
      fVar27 = fVar26;
      fStack_d4 = fVar21 + -1.0;
    }
    uStack_70 = 0;
    pGVar18 = &this->m_fbo;
    vVar1.y = fVar23;
    vVar1.x = fVar24;
    this->m_surfaceSize = vVar1;
    puVar6 = (this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_48.y = fVar26;
    local_48.x = fVar23;
    uStack_40 = CONCAT44(fVar26,fVar26);
    local_68.y = fVar26;
    local_68.x = fVar24;
    uStack_60 = 0;
    local_e8 = fVar25;
    fStack_e0 = fVar27;
    fStack_dc = fVar27;
    local_d8 = fVar20;
    fStack_d0 = fVar22;
    fStack_cc = fVar22;
    local_c8 = fVar24;
    fStack_c4 = fVar23;
    fStack_c0 = fVar26;
    fStack_bc = fVar26;
    local_98 = fStack_d4;
    fStack_94 = fVar21;
    fStack_90 = fVar21;
    fStack_8c = fVar21;
    local_88 = pmVar16;
    local_31 = bVar3;
    if ((this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == puVar6) {
      glGenTextures(1,&local_130);
      fVar23 = local_48.x;
      fVar24 = local_68.x;
      fVar22 = local_130.m[0];
    }
    else {
      fVar22 = (float)puVar6[-1];
      (this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6 + -1;
    }
    e->texture = (uint)fVar22;
    glBindTexture(0xde1);
    glTexParameteri(0xde1,0x2801,0x2601);
    glTexParameteri(0xde1,0x2800,0x2601);
    glTexParameteri(0xde1,0x2802,0x812f);
    glTexParameteri(0xde1,0x2803,0x812f);
    uVar30 = 0;
    uVar29 = 0x1401;
    uVar28 = 0x1908;
    glTexImage2D(0xde1,0,0x1908,(int)fVar24,(int)fVar23,0);
    glGenFramebuffers(1,pGVar18);
    local_50 = pGVar18;
    glBindFramebuffer(0x8d40,*pGVar18);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,e->texture,0);
    iVar8 = glCheckFramebufferStatus(0x8d40);
    if (iVar8 != 0x8cd5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"W [",3);
      log_timestring_abi_cxx11_();
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)CONCAT44(local_130.m[1],local_130.m[0]),
                          local_130.m._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]: ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"void rengine::OpenGLRenderer::renderToLayer(Element *)",0x36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      o_05 = "FBO failed, devRect=";
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"FBO failed, devRect=",0x14);
      r.tl.y = fStack_d4;
      r.tl.x = local_d8;
      r.br.y = fStack_e4;
      r.br.x = local_e8;
      poVar9 = operator<<((rengine *)poVar9,(ostream *)o_05,r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", dim=",6);
      poVar9 = std::ostream::_M_insert<double>((double)local_68.x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      poVar9 = std::ostream::_M_insert<double>((double)local_48.x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", tex=",6);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", fbo=",6);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", error=",8);
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
      glCheckFramebufferStatus(0x8d40);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&local_130);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                    ,0x2fd,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
    }
    local_1b8.m[0] = 1.0;
    local_1b8.m[1] = 0.0;
    local_1b8.m[2] = 0.0;
    local_1b8.m[3] = 0.0;
    local_1b8.m[4] = 0.0;
    local_1b8.m[5] = -1.0;
    local_1b8.m[6] = 0.0;
    local_1b8.m[7] = 0.0;
    local_1b8.m[8] = 0.0;
    local_1b8.m[9] = 0.0;
    local_1b8.m[10] = 1.0;
    local_1b8.m[0xb] = 0.0;
    local_1b8.m[0xc] = 0.0;
    local_1b8.m[0xd] = 0.0;
    local_1b8.m[0xe] = 0.0;
    local_1b8.m[0xf] = 1.0;
    local_1b8.type = 2;
    local_3f0 = 0x3f800000;
    uStack_3e8 = 0xbf80000000000000;
    local_3e0 = 0x3f80000000000000;
    uStack_3d8 = 0x3f80000000000000;
    local_3d0 = 0;
    local_3c8 = 0x3f800000;
    local_3c4 = 0;
    uStack_3bc = 0;
    local_3b4 = 0x13f800000;
    puVar12 = &local_3f0;
    puVar14 = (undefined8 *)&stack0xfffffffffffffbc8;
    for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar14 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
      puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
    }
    o.m[1] = (float)in_stack_fffffffffffffbcc;
    o.m[0] = (float)uVar28;
    o.m[2] = (float)uVar29;
    o.m[3] = (float)in_stack_fffffffffffffbd4;
    o.m[4] = (float)(int)uVar30;
    o.m[5] = (float)(int)((ulong)uVar30 >> 0x20);
    o.m[6] = (float)in_stack_fffffffffffffbe0._0_4_;
    o.m[7] = (float)in_stack_fffffffffffffbe0._4_4_;
    o.m[8] = (float)in_stack_fffffffffffffbe0._8_4_;
    o.m[9] = (float)in_stack_fffffffffffffbe0._12_4_;
    o.m[10] = (float)in_stack_fffffffffffffbe0._16_4_;
    o.m[0xb] = (float)in_stack_fffffffffffffbe0._20_4_;
    o.m[0xc] = (float)in_stack_fffffffffffffbe0._24_4_;
    o.m[0xd] = (float)in_stack_fffffffffffffbe0._28_4_;
    o.m[0xe] = (float)in_stack_fffffffffffffbe0._32_4_;
    o.m[0xf] = (float)in_stack_fffffffffffffbe0._36_4_;
    o.type = 1;
    mat4::operator*(&local_174,&local_1b8,o);
    local_3a8[0] = 2.0 / local_68.x;
    local_3a8[1] = 0.0;
    local_3a8[2] = 0.0;
    local_3a8[3] = 0.0;
    local_3a8[4] = 0.0;
    local_3a8[5] = -2.0 / local_48.x;
    local_390 = 0;
    uStack_388 = 0;
    local_380 = 0x3f800000;
    local_37c = 0;
    uStack_374 = 0;
    local_36c = 0x23f800000;
    pfVar11 = local_3a8;
    puVar12 = (undefined8 *)&stack0xfffffffffffffbc8;
    for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar12 = *(undefined8 *)pfVar11;
      pfVar11 = pfVar11 + ((ulong)bVar19 * -2 + 1) * 2;
      puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
    }
    o_00.m[1] = (float)in_stack_fffffffffffffbcc;
    o_00.m[0] = (float)uVar28;
    o_00.m[2] = (float)uVar29;
    o_00.m[3] = (float)in_stack_fffffffffffffbd4;
    o_00.m[4] = (float)(int)uVar30;
    o_00.m[5] = (float)(int)((ulong)uVar30 >> 0x20);
    o_00.m[6] = (float)in_stack_fffffffffffffbe0._0_4_;
    o_00.m[7] = (float)in_stack_fffffffffffffbe0._4_4_;
    o_00.m[8] = (float)in_stack_fffffffffffffbe0._8_4_;
    o_00.m[9] = (float)in_stack_fffffffffffffbe0._12_4_;
    o_00.m[10] = (float)in_stack_fffffffffffffbe0._16_4_;
    o_00.m[0xb] = (float)in_stack_fffffffffffffbe0._20_4_;
    o_00.m[0xc] = (float)in_stack_fffffffffffffbe0._24_4_;
    o_00.m[0xd] = (float)in_stack_fffffffffffffbe0._28_4_;
    o_00.m[0xe] = (float)in_stack_fffffffffffffbe0._32_4_;
    o_00.m[0xf] = (float)in_stack_fffffffffffffbe0._36_4_;
    o_00.type = 2;
    mat4::operator*((mat4 *)(storedProjection.m + 0xf),&local_174,o_00);
    local_360 = 0x3f800000;
    local_358 = 0;
    local_354 = -local_78.x;
    local_350 = 0x3f80000000000000;
    local_348 = 0;
    local_344 = -local_98;
    local_340 = 0;
    local_338 = 0x3f800000;
    local_334 = 0;
    uStack_32c = 0;
    local_324 = 0x13f800000;
    puVar12 = &local_360;
    puVar14 = (undefined8 *)&stack0xfffffffffffffbc8;
    for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar14 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
      puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
    }
    o_01.m[1] = (float)in_stack_fffffffffffffbcc;
    o_01.m[0] = (float)uVar28;
    o_01.m[2] = (float)uVar29;
    o_01.m[3] = (float)in_stack_fffffffffffffbd4;
    o_01.m[4] = (float)(int)uVar30;
    o_01.m[5] = (float)(int)((ulong)uVar30 >> 0x20);
    o_01.m[6] = (float)in_stack_fffffffffffffbe0._0_4_;
    o_01.m[7] = (float)in_stack_fffffffffffffbe0._4_4_;
    o_01.m[8] = (float)in_stack_fffffffffffffbe0._8_4_;
    o_01.m[9] = (float)in_stack_fffffffffffffbe0._12_4_;
    o_01.m[10] = (float)in_stack_fffffffffffffbe0._16_4_;
    o_01.m[0xb] = (float)in_stack_fffffffffffffbe0._20_4_;
    o_01.m[0xc] = (float)in_stack_fffffffffffffbe0._24_4_;
    o_01.m[0xd] = (float)in_stack_fffffffffffffbe0._28_4_;
    o_01.m[0xe] = (float)in_stack_fffffffffffffbe0._32_4_;
    o_01.m[0xf] = (float)in_stack_fffffffffffffbe0._36_4_;
    o_01.type = 1;
    mat4::operator*(&local_130,(mat4 *)(storedProjection.m + 0xf),o_01);
    pmVar16 = local_88;
    pmVar13 = &local_130;
    pmVar15 = local_88;
    for (lVar10 = 0x11; lVar10 != 0; lVar10 = lVar10 + -1) {
      pmVar15->m[0] = pmVar13->m[0];
      pmVar13 = (mat4 *)((long)pmVar13 + (ulong)bVar19 * -8 + 4);
      pmVar15 = (mat4 *)((long)pmVar15 + (ulong)bVar19 * -8 + 4);
    }
    this->m_matrixState = 0xffffffff;
    glClearColor(0,0,0,0);
    glClear(0x4000);
    render(this,e + 1,e + (ulong)(*(uint *)&e->field_0x18 & 0x1fffffff) + 1);
    pGVar18 = local_50;
    if (local_a8._0_1_ != '\0') {
      local_78.x = (float)e->texture;
      puVar6 = (this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start == puVar6) {
        glGenTextures(1,&local_130);
      }
      else {
        local_130.m[0] = (float)puVar6[-1];
        (this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar6 + -1;
      }
      e->texture = (uint)local_130.m[0];
      local_68 = this->m_vertices[e->vboOffset + 4];
      uStack_60 = 0;
      local_48 = this->m_vertices[e->vboOffset + 7];
      uStack_40 = 0;
      local_1b8.m[0] = 1.0;
      local_1b8.m[1] = 0.0;
      local_1b8.m[2] = 0.0;
      local_1b8.m[3] = 0.0;
      local_1b8.m[4] = 0.0;
      local_1b8.m[5] = -1.0;
      local_1b8.m[6] = 0.0;
      local_1b8.m[7] = 0.0;
      local_1b8.m[8] = 0.0;
      local_1b8.m[9] = 0.0;
      local_1b8.m[10] = 1.0;
      local_1b8.m[0xb] = 0.0;
      local_1b8.m[0xc] = 0.0;
      local_1b8.m[0xd] = 0.0;
      local_1b8.m[0xe] = 0.0;
      local_1b8.m[0xf] = 1.0;
      local_1b8.type = 2;
      local_318 = 0x3f800000;
      uStack_310 = 0xbf80000000000000;
      local_308 = 0x3f80000000000000;
      uStack_300 = 0x3f80000000000000;
      local_2f8 = 0;
      local_2f0 = 0x3f800000;
      local_2ec = 0;
      uStack_2e4 = 0;
      local_2dc = 0x13f800000;
      puVar12 = &local_318;
      puVar14 = (undefined8 *)&stack0xfffffffffffffbc8;
      for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar14 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      }
      o_02.m[1] = (float)in_stack_fffffffffffffbcc;
      o_02.m[0] = (float)uVar28;
      o_02.m[2] = (float)uVar29;
      o_02.m[3] = (float)in_stack_fffffffffffffbd4;
      o_02.m[4] = (float)(int)uVar30;
      o_02.m[5] = (float)(int)((ulong)uVar30 >> 0x20);
      o_02.m[6] = (float)in_stack_fffffffffffffbe0._0_4_;
      o_02.m[7] = (float)in_stack_fffffffffffffbe0._4_4_;
      o_02.m[8] = (float)in_stack_fffffffffffffbe0._8_4_;
      o_02.m[9] = (float)in_stack_fffffffffffffbe0._12_4_;
      o_02.m[10] = (float)in_stack_fffffffffffffbe0._16_4_;
      o_02.m[0xb] = (float)in_stack_fffffffffffffbe0._20_4_;
      o_02.m[0xc] = (float)in_stack_fffffffffffffbe0._24_4_;
      o_02.m[0xd] = (float)in_stack_fffffffffffffbe0._28_4_;
      o_02.m[0xe] = (float)in_stack_fffffffffffffbe0._32_4_;
      o_02.m[0xf] = (float)in_stack_fffffffffffffbe0._36_4_;
      o_02.type = 1;
      mat4::operator*(&local_174,&local_1b8,o_02);
      local_48.x = local_48.x - local_68.x;
      local_48.y = local_48.y - local_68.y;
      uStack_40 = CONCAT44(uStack_40._4_4_ - uStack_60._4_4_,(float)uStack_40 - (float)uStack_60);
      local_a8 = local_48.y;
      fStack_a4 = local_48.y;
      fStack_a0 = local_48.y;
      fStack_9c = local_48.y;
      local_98 = local_68.y;
      fStack_94 = local_68.y;
      fStack_90 = local_68.y;
      fStack_8c = local_68.y;
      local_2d0[0] = 2.0 / local_48.x;
      local_2d0[1] = 0.0;
      local_2d0[2] = 0.0;
      local_2d0[3] = 0.0;
      local_2d0[4] = 0.0;
      local_2d0[5] = -2.0 / local_48.y;
      local_2b8 = 0;
      uStack_2b0 = 0;
      local_2a8 = 0x3f800000;
      local_2a4 = 0;
      uStack_29c = 0;
      local_294 = 0x23f800000;
      pfVar11 = local_2d0;
      puVar12 = (undefined8 *)&stack0xfffffffffffffbc8;
      for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar12 = *(undefined8 *)pfVar11;
        pfVar11 = pfVar11 + ((ulong)bVar19 * -2 + 1) * 2;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
      }
      o_03.m[1] = (float)in_stack_fffffffffffffbcc;
      o_03.m[0] = (float)uVar28;
      o_03.m[2] = (float)uVar29;
      o_03.m[3] = (float)in_stack_fffffffffffffbd4;
      o_03.m[4] = (float)(int)uVar30;
      o_03.m[5] = (float)(int)((ulong)uVar30 >> 0x20);
      o_03.m[6] = (float)in_stack_fffffffffffffbe0._0_4_;
      o_03.m[7] = (float)in_stack_fffffffffffffbe0._4_4_;
      o_03.m[8] = (float)in_stack_fffffffffffffbe0._8_4_;
      o_03.m[9] = (float)in_stack_fffffffffffffbe0._12_4_;
      o_03.m[10] = (float)in_stack_fffffffffffffbe0._16_4_;
      o_03.m[0xb] = (float)in_stack_fffffffffffffbe0._20_4_;
      o_03.m[0xc] = (float)in_stack_fffffffffffffbe0._24_4_;
      o_03.m[0xd] = (float)in_stack_fffffffffffffbe0._28_4_;
      o_03.m[0xe] = (float)in_stack_fffffffffffffbe0._32_4_;
      o_03.m[0xf] = (float)in_stack_fffffffffffffbe0._36_4_;
      o_03.type = 2;
      mat4::operator*((mat4 *)(storedProjection.m + 0xf),&local_174,o_03);
      local_288 = 0x3f800000;
      local_280 = 0;
      local_27c = -local_68.x;
      local_278 = 0x3f80000000000000;
      local_270 = 0;
      local_26c = -local_98;
      local_268 = 0;
      local_260 = 0x3f800000;
      local_25c = 0;
      uStack_254 = 0;
      local_24c = 0x13f800000;
      puVar12 = &local_288;
      puVar14 = (undefined8 *)&stack0xfffffffffffffbc8;
      for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar14 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      }
      o_04.m[1] = (float)in_stack_fffffffffffffbcc;
      o_04.m[0] = (float)uVar28;
      o_04.m[2] = (float)uVar29;
      o_04.m[3] = (float)in_stack_fffffffffffffbd4;
      o_04.m[4] = (float)(int)uVar30;
      o_04.m[5] = (float)(int)((ulong)uVar30 >> 0x20);
      o_04.m[6] = (float)in_stack_fffffffffffffbe0._0_4_;
      o_04.m[7] = (float)in_stack_fffffffffffffbe0._4_4_;
      o_04.m[8] = (float)in_stack_fffffffffffffbe0._8_4_;
      o_04.m[9] = (float)in_stack_fffffffffffffbe0._12_4_;
      o_04.m[10] = (float)in_stack_fffffffffffffbe0._16_4_;
      o_04.m[0xb] = (float)in_stack_fffffffffffffbe0._20_4_;
      o_04.m[0xc] = (float)in_stack_fffffffffffffbe0._24_4_;
      o_04.m[0xd] = (float)in_stack_fffffffffffffbe0._28_4_;
      o_04.m[0xe] = (float)in_stack_fffffffffffffbe0._32_4_;
      o_04.m[0xf] = (float)in_stack_fffffffffffffbe0._36_4_;
      o_04.type = 1;
      mat4::operator*(&local_130,(mat4 *)(storedProjection.m + 0xf),o_04);
      pmVar16 = local_88;
      pmVar13 = &local_130;
      pmVar15 = local_88;
      for (lVar10 = 0x11; lVar10 != 0; lVar10 = lVar10 + -1) {
        pmVar15->m[0] = pmVar13->m[0];
        pmVar13 = (mat4 *)((long)pmVar13 + (ulong)bVar19 * -8 + 4);
        pmVar15 = (mat4 *)((long)pmVar15 + (ulong)bVar19 * -8 + 4);
      }
      this->m_matrixState = 0xffffffff;
      iVar8 = (int)local_48.x;
      iVar17 = (int)local_a8;
      glBindTexture(0xde1,e->texture);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2802,0x812f);
      glTexParameteri(0xde1,0x2803,0x812f);
      glTexImage2D(0xde1,0,0x1908,iVar8,iVar17,0);
      glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,e->texture,0);
      glClear(0x4000);
      glViewport(0,0,iVar8,iVar17);
      pGVar18 = local_50;
      fVar22 = local_78.x;
      if (local_b0 == (Node *)0x0) {
        if (local_80 != (Node *)0x0) {
          textureSize_00.y = fStack_c4;
          textureSize_00.x = local_c8;
          vVar2.y = 0.0;
          vVar2.x = 1.0 / local_48.x;
          drawShadowQuad(this,e->vboOffset + 4,(GLuint)local_78.x,*(int *)&local_80->field_0x34,
                         local_48,textureSize_00,vVar2,(vec4)(ZEXT816(0x3f80000000000000) << 0x40));
          e->sourceTexture = (uint)fVar22;
        }
      }
      else {
        textureSize.y = fStack_c4;
        textureSize.x = local_c8;
        step.y = 0.0;
        step.x = 1.0 / local_48.x;
        drawBlurQuad(this,e->vboOffset + 4,(GLuint)local_78.x,*(int *)&local_b0->field_0x34,local_48
                     ,textureSize,step);
        TexturePool::release(&this->m_texturePool,(GLuint)fVar22);
        pGVar18 = local_50;
      }
    }
    glBindFramebuffer(0x8d40,this->m_fbo);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,0,0);
    GVar7 = local_54;
    glBindFramebuffer(0x8d40,local_54);
    glDeleteFramebuffers(1,pGVar18);
    this->m_fbo = GVar7;
    this->field_0x1f8 = local_31 & 3 | this->field_0x1f8 & 0xfc;
    pfVar11 = local_240;
    for (lVar10 = 0x11; lVar10 != 0; lVar10 = lVar10 + -1) {
      pmVar16->m[0] = *pfVar11;
      pfVar11 = pfVar11 + (ulong)bVar19 * -2 + 1;
      pmVar16 = (mat4 *)((long)pmVar16 + (ulong)bVar19 * -8 + 4);
    }
    this->m_matrixState = 0xffffffff;
    this->m_surfaceSize = local_b8;
  }
  return;
}

Assistant:

inline void OpenGLRenderer::renderToLayer(Element *e)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "- doing layered rendering for: element=" << e << " node=" << e->node << std::endl;
    assert(e->layered);

    // Create the FBO
    rect2d devRect = boundingRectFor(e->vboOffset);

    // Abort the render to layer pass if the dev rect happens to be zero..
    if (devRect.width() <= 0 || devRect.height() <= 0) {
        return;
    }

    // Store current state...
    bool stored3d = m_render3d;
    bool storedTextureed = m_layered;
    GLuint storedFbo = m_fbo;
    mat4 storedProjection = m_proj;
    vec2 storedSize = m_surfaceSize;

    m_render3d |= e->projection;
    m_layered = true;


    BlurNode *blurNode = BlurNode::from(e->node);
    ShadowNode *shadowNode = ShadowNode::from(e->node);

    if (blurNode || shadowNode) {
        devRect.tl -= 1.0f;
        devRect.br += 1.0f;
    }

    // std::cout << space << " ---> from " << e->vboOffset << " " << m_vertices[e->vboOffset] << " " << m_vertices[e->vboOffset+3] << std::endl;

    m_surfaceSize = devRect.size();

    e->texture = m_texturePool.acquire();
    rengine_create_texture(e->texture, devRect.width(), devRect.height());

    glGenFramebuffers(1, &m_fbo);
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);

#ifndef NDEBUG
    // Only enabled in debug mode because it syncs the GL stack and takes forever..
    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        logw << "FBO failed, devRect=" << devRect
             << ", dim=" << devRect.width() << "x" << devRect.height() << ", tex=" << e->texture << ", fbo=" << m_fbo << ", error="
             << std::hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << std::endl;
        assert(false);
    }
#endif

    // Render the layered group
    m_proj = mat4::scale2D(1.0, -1.0)
             * mat4::translate2D(-1.0, 1.0)
             * mat4::scale2D(2.0f / devRect.width(), -2.0f / devRect.height())
             * mat4::translate2D(-devRect.tl.x, -devRect.tl.y);
    m_matrixState = UpdateAllPrograms;

    // std::cout << " ---> rect=" << devRect << " texture=" << e->texture << " fbo=" << m_fbo
    //           << " status=" << hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << " ok=" << GL_FRAMEBUFFER_COMPLETE
    //           << " " << m_proj << std::endl;

    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);
    render(e + 1, e + e->groupSize + 1);

    if (blurNode || shadowNode) {
        int tmpTex = e->texture;
        e->texture = m_texturePool.acquire();
        rect2d expandedWidth = boundingRectFor(e->vboOffset + 4);
        m_proj = mat4::scale2D(1.0, -1.0)
                 * mat4::translate2D(-1.0, 1.0)
                 * mat4::scale2D(2.0f / expandedWidth.width(), -2.0f / expandedWidth.height())
                 * mat4::translate2D(-expandedWidth.tl.x, -expandedWidth.tl.y);
        m_matrixState = UpdateAllPrograms;
        rengine_create_texture(e->texture, expandedWidth.width(), expandedWidth.height());
        glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);
        glClear(GL_COLOR_BUFFER_BIT);
        glViewport(0, 0, expandedWidth.width(), expandedWidth.height());
        if (blurNode) {
            drawBlurQuad(e->vboOffset + 4, tmpTex, blurNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0));
            m_texturePool.release(tmpTex);
        } else if (shadowNode) {
            drawShadowQuad(e->vboOffset + 4, tmpTex, shadowNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0), vec4(0, 0, 0, 1));
            e->sourceTexture = tmpTex;
        }
    }

    // Reset the GL state..
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
    glBindFramebuffer(GL_FRAMEBUFFER, storedFbo);
    glDeleteFramebuffers(1, &m_fbo);

    // Reset the old state...
    m_fbo = storedFbo;
    m_render3d = stored3d;
    m_layered = storedTextureed;
    m_proj = storedProjection;
    m_matrixState = UpdateAllPrograms;
    m_surfaceSize = storedSize;

    // std::cout << space << "- layer is completed..." << std::endl;
}